

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O2

string_view
winmd::reader::read<std::basic_string_view<char,std::char_traits<char>>>(byte_view *cursor)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  string_view sVar3;
  byte_view local_38;
  
  uVar2 = uncompress_unsigned(cursor);
  puVar1 = cursor->m_first;
  byte_view::seek(&local_38,(uint32_t)cursor);
  cursor->m_first = local_38.m_first;
  cursor->m_last = local_38.m_last;
  sVar3._M_str = (char *)puVar1;
  sVar3._M_len = (ulong)uVar2;
  return sVar3;
}

Assistant:

inline std::string_view read<std::string_view>(byte_view& cursor)
    {
        uint32_t const length = uncompress_unsigned(cursor);
        std::string_view result{ reinterpret_cast<const char*>(cursor.begin()), length };
        cursor = cursor.seek(length);
        return result;
    }